

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUFA.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_176::GUFAOptimizer::visitExpression(GUFAOptimizer *this,Expression *curr)

{
  ulong uVar1;
  PassRunner *pPVar2;
  Module *wasm;
  bool bVar3;
  MemoryOrder MVar4;
  Type TVar5;
  Expression *pEVar6;
  PassOptions *options;
  undefined1 local_50 [8];
  PossibleContents contents;
  
  uVar1 = (curr->type).id;
  if (uVar1 < 2) {
    return;
  }
  bVar3 = Properties::isConstantExpression(curr);
  if (bVar3) {
    return;
  }
  if ((6 < uVar1 & (byte)uVar1) != 0) {
    return;
  }
  getContents((PossibleContents *)local_50,this,curr);
  pPVar2 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
           ).super_Pass.runner;
  wasm = (this->
         super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
         ).
         super_PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
         .
         super_Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
         .currModule;
  TVar5 = PossibleContents::getType((PossibleContents *)local_50);
  options = &pPVar2->options;
  if (TVar5.id == 1) {
    pEVar6 = (Expression *)MixedArena::alloc<wasm::Unreachable>(&wasm->allocator);
    pEVar6 = getDroppedChildrenAndAppend(curr,wasm,options,pEVar6,NoticeParentEffects);
    replaceCurrent(this,pEVar6);
  }
  else {
    if ((1 < (byte)(contents.value.
                    super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    .
                    super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    .
                    super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    .
                    super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    .
                    super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    .
                    super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    ._M_u._16_1_ - 1)) ||
       (MVar4 = Properties::getMemoryOrder(curr), MVar4 != Unordered)) goto LAB_00a0dc78;
    pEVar6 = PossibleContents::makeExpression((PossibleContents *)local_50,wasm);
    bVar3 = wasm::Type::isSubType((Type)(pEVar6->type).id,(Type)(curr->type).id);
    if (bVar3) {
      pEVar6 = getDroppedChildrenAndAppend(curr,wasm,options,pEVar6,NoticeParentEffects);
    }
    else {
      bVar3 = Properties::isConstantExpression(pEVar6);
      if (!bVar3) {
        if (pEVar6->_id != GlobalGetId) {
          __assert_fail("c->is<GlobalGet>()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GUFA.cpp"
                        ,0xd1,
                        "void wasm::(anonymous namespace)::GUFAOptimizer::visitExpression(Expression *)"
                       );
        }
        goto LAB_00a0dc78;
      }
      pEVar6 = (Expression *)MixedArena::alloc<wasm::Unreachable>(&wasm->allocator);
      pEVar6 = getDroppedChildrenAndAppend(curr,wasm,options,pEVar6,NoticeParentEffects);
    }
    replaceCurrent(this,pEVar6);
  }
  this->optimized = true;
LAB_00a0dc78:
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                       *)local_50);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    // Skip things we can't improve in any way.
    auto type = curr->type;
    if (type == Type::unreachable || type == Type::none ||
        Properties::isConstantExpression(curr)) {
      return;
    }

    if (type.isTuple()) {
      // TODO: tuple types.
      return;
    }

    // Ok, this is an interesting location that we might optimize. See what the
    // oracle says is possible there.
    auto contents = getContents(curr);

    auto& options = getPassOptions();
    auto& wasm = *getModule();
    Builder builder(wasm);

    if (contents.getType() == Type::unreachable) {
      // This cannot contain any possible value at all. It must be unreachable
      // code.
      replaceCurrent(getDroppedChildrenAndAppend(
        curr, wasm, options, builder.makeUnreachable()));
      optimized = true;
      return;
    }

    // This is reachable. Check if we can emit something optimized for it.
    // TODO: can we handle more general things here too?
    if (!contents.canMakeExpression()) {
      return;
    }

    if (Properties::getMemoryOrder(curr) != MemoryOrder::Unordered) {
      // This load might synchronize with some store, and if we replaced the
      // load with a constant or with a load from a global, it would not
      // synchronize with that store anymore.
      return;
    }

    auto* c = contents.makeExpression(wasm);

    // We can only place the constant value here if it has the right type. For
    // example, a block may return (ref any), that is, not allow a null, but in
    // practice only a null may flow there if it goes through casts that will
    // trap at runtime.
    // TODO: GUFA should eventually do this, but it will require it properly
    //       filtering content not just on ref.cast as it does now, but also
    //       ref.as etc. Once it does those we could assert on the type being
    //       valid here.
    if (Type::isSubType(c->type, curr->type)) {
      replaceCurrent(getDroppedChildrenAndAppend(curr, wasm, options, c));
      optimized = true;
    } else {
      // The type is not compatible: we cannot place |c| in this location, even
      // though we have proven it is the only value possible here.
      if (Properties::isConstantExpression(c)) {
        // The type is not compatible and this is a simple constant expression
        // like a ref.func. That means this code must be unreachable. (See below
        // for the case of a non-constant.)
        replaceCurrent(getDroppedChildrenAndAppend(
          curr, wasm, options, builder.makeUnreachable()));
        optimized = true;
      } else {
        // This is not a constant expression, but we are certain it is the right
        // value. Atm the only such case we handle is a global.get of an
        // immutable global. We don't know what the value will be, nor its
        // specific type, but we do know that a global.get will get that value
        // properly. However, in this case it does not have the right type for
        // this location. That can happen since the global.get does not have
        // exactly the proper type for the contents: the global.get might be
        // nullable, for example, even though the contents are not actually a
        // null. For example, consider what happens here:
        //
        //  (global $foo (ref null any) (struct.new $Foo))
        //  ..
        //    (ref.as_non_null
        //      (global.get $foo))
        //
        // We create a $Foo in the global $foo, so its value is not a null. But
        // the global's type is nullable, so the global.get's type will be as
        // well. When we get to the ref.as_non_null, we then want to replace it
        // with a global.get - in fact that's what its child already is, showing
        // it is the right content for it - but that global.get would not have a
        // non-nullable type like a ref.as_non_null must have, so we cannot
        // simply replace it.
        //
        // For now, do nothing here, but in some cases we could probably
        // optimize (e.g. by adding a ref.as_non_null in the example) TODO
        assert(c->is<GlobalGet>());
      }
    }
  }